

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionRTQF.cpp
# Opt level: O1

void __thiscall RTFusionRTQF::predict(RTFusionRTQF *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  if ((this->super_RTFusion).m_enableGyro == true) {
    fVar1 = this->m_timeDelta;
    fVar2 = (this->m_stateQ).m_data[0];
    fVar3 = (this->m_stateQ).m_data[1];
    fVar4 = (this->m_stateQ).m_data[2];
    fVar5 = (this->m_stateQ).m_data[3];
    fVar7 = (this->m_gyro).m_data[0] * 0.5;
    fVar8 = (this->m_gyro).m_data[1] * 0.5;
    fVar6 = (this->m_gyro).m_data[2] * 0.5;
    (this->m_stateQ).m_data[0] = ((-fVar7 * fVar3 - fVar4 * fVar8) - fVar6 * fVar5) * fVar1 + fVar2;
    (this->m_stateQ).m_data[1] = ((fVar7 * fVar2 + fVar4 * fVar6) - fVar8 * fVar5) * fVar1 + fVar3;
    (this->m_stateQ).m_data[2] = (fVar7 * fVar5 + (fVar8 * fVar2 - fVar3 * fVar6)) * fVar1 + fVar4;
    (this->m_stateQ).m_data[3] = ((fVar6 * fVar2 + fVar3 * fVar8) - fVar7 * fVar4) * fVar1 + fVar5;
    RTQuaternion::normalize(&this->m_stateQ);
    return;
  }
  return;
}

Assistant:

void RTFusionRTQF::predict()
{
    RTFLOAT x2, y2, z2;
    RTFLOAT qs, qx, qy,qz;

    if (!m_enableGyro)
        return;

    qs = m_stateQ.scalar();
    qx = m_stateQ.x();
    qy = m_stateQ.y();
    qz = m_stateQ.z();

    x2 = m_gyro.x() / (RTFLOAT)2.0;
    y2 = m_gyro.y() / (RTFLOAT)2.0;
    z2 = m_gyro.z() / (RTFLOAT)2.0;

    // Predict new state

    m_stateQ.setScalar(qs + (-x2 * qx - y2 * qy - z2 * qz) * m_timeDelta);
    m_stateQ.setX(qx + (x2 * qs + z2 * qy - y2 * qz) * m_timeDelta);
    m_stateQ.setY(qy + (y2 * qs - z2 * qx + x2 * qz) * m_timeDelta);
    m_stateQ.setZ(qz + (z2 * qs + y2 * qx - x2 * qy) * m_timeDelta);
    m_stateQ.normalize();
}